

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintSkippedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  TestSuite *this;
  TestInfo *this_00;
  TestResult *this_01;
  char *pcVar3;
  char *pcVar4;
  TestInfo *test_info;
  int j;
  TestSuite *test_suite;
  int i;
  int skipped_test_count;
  UnitTest *unit_test_local;
  
  iVar2 = UnitTest::skipped_test_count(unit_test);
  if (iVar2 != 0) {
    for (test_suite._0_4_ = 0; iVar2 = UnitTest::total_test_suite_count(unit_test),
        (int)test_suite < iVar2; test_suite._0_4_ = (int)test_suite + 1) {
      this = UnitTest::GetTestSuite(unit_test,(int)test_suite);
      bVar1 = TestSuite::should_run(this);
      if ((bVar1) && (iVar2 = TestSuite::skipped_test_count(this), iVar2 != 0)) {
        for (test_info._4_4_ = 0; iVar2 = TestSuite::total_test_count(this), test_info._4_4_ < iVar2
            ; test_info._4_4_ = test_info._4_4_ + 1) {
          this_00 = TestSuite::GetTestInfo(this,test_info._4_4_);
          bVar1 = TestInfo::should_run(this_00);
          if (bVar1) {
            this_01 = TestInfo::result(this_00);
            bVar1 = TestResult::Skipped(this_01);
            if (bVar1) {
              ColoredPrintf(kGreen,"[  SKIPPED ] ");
              pcVar3 = TestSuite::name(this);
              pcVar4 = TestInfo::name(this_00);
              printf("%s.%s",pcVar3,pcVar4);
              printf("\n");
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintSkippedTests(const UnitTest& unit_test) {
  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.skipped_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Skipped()) {
        continue;
      }
      ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      printf("\n");
    }
  }
}